

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O1

void __thiscall Diligent::GLContextState::BindVAO(GLContextState *this,GLVertexArrayObj *VAO)

{
  GLuint GVar1;
  int iVar2;
  GLenum err;
  string msg;
  uint local_3c;
  string local_38;
  
  GVar1 = VAO->m_uiHandle;
  if (GVar1 == 0) {
    iVar2 = 0;
  }
  else {
    if ((VAO->m_UniqueId).m_ID == 0) {
      LOCK();
      UNLOCK();
      iVar2 = UniqueIdHelper<GLObjectWrappers::GLVAOCreateReleaseHelper>::GetID()::GlobalCounter + 1
      ;
      UniqueIdHelper<GLObjectWrappers::GLVAOCreateReleaseHelper>::GetID()::GlobalCounter =
           UniqueIdHelper<GLObjectWrappers::GLVAOCreateReleaseHelper>::GetID()::GlobalCounter + 1;
      (VAO->m_UniqueId).m_ID = iVar2;
    }
    iVar2 = (VAO->m_UniqueId).m_ID;
  }
  if (this->m_VAOId != iVar2) {
    this->m_VAOId = iVar2;
    (*__glewBindVertexArray)(GVar1);
    local_3c = glGetError();
    if (local_3c != 0) {
      LogError<false,char[18],char[17],unsigned_int>
                (false,"BindVAO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xb0,(char (*) [18])"Failed to set VAO",(char (*) [17])"\nGL Error Code: ",
                 &local_3c);
      FormatString<char[6]>(&local_38,(char (*) [6])0x32952e);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"BindVAO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xb0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void GLContextState::BindVAO(const GLVertexArrayObj& VAO)
{
    GLuint VAOHandle = 0;
    if (UpdateBoundObject(m_VAOId, VAO, VAOHandle))
    {
        glBindVertexArray(VAOHandle);
        DEV_CHECK_GL_ERROR("Failed to set VAO");
    }
}